

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Triangle::Area(Triangle *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  type tVar6;
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3<float> VVar12;
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20;
  Tuple3<pbrt::Vector3,_float> local_10;
  
  lVar1 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar3 = *(long *)(lVar1 + 8);
  lVar2 = (long)this->triIndex * 0xc;
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar4 = (long)*(int *)(lVar3 + lVar2) * 0xc;
  lVar5 = (long)*(int *)(lVar3 + 4 + lVar2) * 0xc;
  lVar3 = (long)*(int *)(lVar3 + 8 + lVar2) * 0xc;
  local_30.z = *(float *)(lVar1 + 8 + lVar4);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(lVar1 + lVar4);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(lVar1 + lVar5);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(lVar1 + lVar3);
  auVar10 = vsubps_avx(auVar10,auVar9);
  local_20.z = *(float *)(lVar1 + 8 + lVar5) - local_30.z;
  local_30.z = *(float *)(lVar1 + 8 + lVar3) - local_30.z;
  auVar8 = (undefined1  [56])0x0;
  local_20._0_8_ = vmovlps_avx(auVar10);
  auVar10 = vsubps_avx(auVar11,auVar9);
  local_30._0_8_ = vmovlps_avx(auVar10);
  VVar12 = Cross<float>((Vector3<float> *)&local_20,(Vector3<float> *)&local_30);
  local_10.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  local_10._0_8_ = vmovlps_avx(auVar7._0_16_);
  tVar6 = Length<float>((Vector3<float> *)&local_10);
  return tVar6 * 0.5;
}

Assistant:

PBRT_CPU_GPU
    Float Area() const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return 0.5f * Length(Cross(p1 - p0, p2 - p0));
    }